

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86.cpp
# Opt level: O3

int __thiscall ncnn::Convolution1D_x86::create_pipeline(Convolution1D_x86 *this,Option *opt)

{
  uint _c;
  _func_int **pp_Var1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  int _h;
  undefined4 *puVar5;
  int i;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  undefined4 *puVar10;
  undefined4 *puVar11;
  ulong uVar12;
  _func_int *p_Var13;
  int iVar14;
  ulong uVar15;
  undefined4 *puVar16;
  int iVar17;
  ulong uVar18;
  undefined4 *puVar19;
  Mat local_78;
  
  p_Var13 = this->_vptr_Convolution1D_x86[-3];
  if (*(int *)(&this->field_0x140 + (long)p_Var13) == 0) {
    _c = *(uint *)(&this->field_0xd0 + (long)p_Var13);
    uVar9 = (long)*(int *)(&this->field_0xf0 + (long)p_Var13) /
            (long)*(int *)(&this->field_0xd4 + (long)p_Var13);
    uVar9 = (long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) / (long)(int)_c;
    _h = (int)uVar9;
    uVar15 = 1;
    uVar18 = 1;
    if (opt->use_packing_layout == true) {
      uVar15 = (ulong)((uint)((uVar9 & 3) == 0) * 3 + 1);
      uVar18 = (ulong)((uint)((_c & 3) == 0) * 3 + 1);
    }
    Mat::reshape(&local_78,(Mat *)(&this->field_0x148 + (long)p_Var13),
                 *(int *)(&this->field_0xd4 + (long)p_Var13),_h,_c,(Allocator *)0x0);
    iVar14 = (int)uVar15;
    iVar17 = (int)uVar18;
    Mat::create(&this->weight_data_packed,
                *(int *)(&this->field_0xd4 + (long)this->_vptr_Convolution1D_x86[-3]),
                (int)((long)((ulong)(uint)(_h >> 0x1f) << 0x20 | uVar9 & 0xffffffff) / (long)iVar14)
                ,*(int *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86[-3]) / iVar17,
                (ulong)(uint)(iVar17 * iVar14 * 4),iVar17 * iVar14,(Allocator *)0x0);
    pp_Var1 = this->_vptr_Convolution1D_x86;
    p_Var13 = pp_Var1[-3];
    if (iVar17 <= *(int *)(&this->field_0xd0 + (long)p_Var13)) {
      pvVar2 = (this->weight_data_packed).data;
      sVar3 = (this->weight_data_packed).cstep;
      sVar4 = (this->weight_data_packed).elemsize;
      uVar9 = 0;
      do {
        if (iVar14 <= _h) {
          puVar5 = (undefined4 *)(((uVar9 & 0xffffffff) / uVar18) * sVar3 * sVar4 + (long)pvVar2);
          puVar19 = (undefined4 *)(local_78.cstep * local_78.elemsize * uVar9 + (long)local_78.data)
          ;
          lVar7 = 0;
          do {
            if (0 < *(int *)(&this->field_0xd4 + (long)p_Var13)) {
              lVar8 = 0;
              puVar16 = puVar19;
              do {
                uVar6 = 0;
                uVar12 = uVar18;
                puVar11 = puVar16;
                puVar10 = puVar16;
                do {
                  do {
                    *puVar5 = *puVar11;
                    puVar5 = puVar5 + 1;
                    uVar12 = uVar12 - 1;
                    puVar11 = (undefined4 *)((long)puVar11 + local_78.cstep * local_78.elemsize);
                  } while (uVar12 != 0);
                  uVar6 = uVar6 + 1;
                  puVar11 = (undefined4 *)((long)puVar10 + (long)local_78.w * local_78.elemsize);
                  uVar12 = uVar18;
                  puVar10 = puVar11;
                } while (uVar6 != uVar15);
                lVar8 = lVar8 + 1;
                p_Var13 = pp_Var1[-3];
                puVar16 = puVar16 + 1;
              } while (lVar8 < *(int *)(&this->field_0xd4 + (long)p_Var13));
            }
            lVar7 = lVar7 + uVar15;
            puVar19 = (undefined4 *)((long)puVar19 + (long)local_78.w * local_78.elemsize * uVar15);
          } while (lVar7 < (long)((long)_h - (ulong)(iVar14 - 1)));
        }
        uVar9 = uVar9 + uVar18;
      } while ((long)((iVar17 - 1) + uVar9) < (long)*(int *)(&this->field_0xd0 + (long)p_Var13));
    }
    if (local_78.refcount != (int *)0x0) {
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return 0;
}

Assistant:

int Convolution1D_x86::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    int num_input = weight_data_size / kernel_w / num_output;

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // src = kw-inch-outch
    // dst = pb-pa-kw-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(kernel_w, num_input, num_output);

        weight_data_packed.create(kernel_w, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            float* g00 = weight_data_packed.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                for (int k = 0; k < kernel_w; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    return 0;
}